

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

ostream * __thiscall smf::Options::print(Options *this,ostream *out)

{
  Option_register *pOVar1;
  pointer ppOVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  
  ppOVar2 = (this->m_optionRegister).
            super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_optionRegister).
      super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppOVar2) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(ppOVar2[uVar5]->definition)._M_dataplus._M_p,
                          (ppOVar2[uVar5]->definition)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
      pOVar1 = (this->m_optionRegister).
               super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar5];
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(pOVar1->description)._M_dataplus._M_p,
                          (pOVar1->description)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar5 = (ulong)uVar4;
      ppOVar2 = (this->m_optionRegister).
                super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)((long)(this->m_optionRegister).
                                   super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar2 >> 3))
    ;
  }
  return out;
}

Assistant:

std::ostream& Options::print(std::ostream& out) {
   for (unsigned int i=0; i<m_optionRegister.size(); i++) {
      out << m_optionRegister[i]->getDefinition() << "\t"
           << m_optionRegister[i]->getDescription() << std::endl;
   }
   return out;
}